

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqltablemodel.cpp
# Opt level: O2

bool __thiscall QSqlTableModel::deleteRowFromTable(QSqlTableModel *this,int row)

{
  QSqlDatabase *this_00;
  long lVar1;
  QSqlTableModelPrivate *this_01;
  QExplicitlySharedDataPointer<QSqlErrorPrivate> QVar2;
  bool bVar3;
  QSqlDriver *pQVar4;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QArrayDataPointer<char16_t> local_d8;
  QArrayDataPointer<char16_t> local_b8;
  QArrayDataPointer<char16_t> local_98;
  QSqlError local_80;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_58;
  QSqlRecord whereValues;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QSqlTableModelPrivate **)&(this->super_QSqlQueryModel).field_0x8;
  beforeDelete(this,row);
  whereValues.d.d.ptr = (QExplicitlySharedDataPointer<QSqlRecordPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  primaryValues((QSqlTableModel *)&whereValues,(int)this);
  this_00 = &this_01->db;
  pQVar4 = QSqlDatabase::driver(this_00);
  bVar3 = (bool)(**(code **)(*(long *)pQVar4 + 0xb8))(pQVar4,4);
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar4 = QSqlDatabase::driver(this_00);
  QSqlRecord::QSqlRecord((QSqlRecord *)&local_78);
  (**(code **)(*(long *)pQVar4 + 0xa8))(&local_58,pQVar4,4,&this_01->tableName,&local_78,bVar3);
  QSqlRecord::~QSqlRecord((QSqlRecord *)&local_78);
  local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar4 = QSqlDatabase::driver(this_00);
  (**(code **)(*(long *)pQVar4 + 0xa8))(&local_78,pQVar4,0,&this_01->tableName,&whereValues,bVar3);
  if (((undefined1 *)local_58.size == (undefined1 *)0x0) ||
     ((undefined1 *)local_78.size == (undefined1 *)0x0)) {
    latin1.m_data = "Unable to delete row";
    latin1.m_size = 0x14;
    QString::QString((QString *)&local_98,latin1);
    local_b8.d = (Data *)0x0;
    local_b8.ptr = (char16_t *)0x0;
    local_b8.size = 0;
    local_d8.d = (Data *)0x0;
    local_d8.ptr = (char16_t *)0x0;
    local_d8.size = 0;
    QSqlError::QSqlError
              (&local_80,(QString *)&local_98,(QString *)&local_b8,StatementError,
               (QString *)&local_d8);
    QVar2.d.ptr = (totally_ordered_wrapper<QSqlErrorPrivate_*>)
                  (this_01->super_QSqlQueryModelPrivate).error.d.d.ptr;
    (this_01->super_QSqlQueryModelPrivate).error.d.d.ptr = (QSqlErrorPrivate *)local_80.d.d.ptr;
    local_80.d.d.ptr =
         (QExplicitlySharedDataPointer<QSqlErrorPrivate>)
         (QExplicitlySharedDataPointer<QSqlErrorPrivate>)QVar2.d.ptr;
    QSqlError::~QSqlError(&local_80);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
    bVar3 = false;
  }
  else {
    QSqlQueryModelSql::concat((QString *)&local_98,(QString *)&local_58,(QString *)&local_78);
    QSqlRecord::QSqlRecord((QSqlRecord *)&local_b8);
    bVar3 = QSqlTableModelPrivate::exec
                      (this_01,(QString *)&local_98,bVar3,(QSqlRecord *)&local_b8,&whereValues);
    QSqlRecord::~QSqlRecord((QSqlRecord *)&local_b8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QSqlRecord::~QSqlRecord(&whereValues);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QSqlTableModel::deleteRowFromTable(int row)
{
    Q_D(QSqlTableModel);
    emit beforeDelete(row);

    const QSqlRecord whereValues = primaryValues(row);
    const bool prepStatement = d->db.driver()->hasFeature(QSqlDriver::PreparedQueries);
    const QString stmt = d->db.driver()->sqlStatement(QSqlDriver::DeleteStatement,
                                                      d->tableName,
                                                      QSqlRecord(),
                                                      prepStatement);
    const QString where = d->db.driver()->sqlStatement(QSqlDriver::WhereStatement,
                                                       d->tableName,
                                                       whereValues,
                                                       prepStatement);

    if (stmt.isEmpty() || where.isEmpty()) {
        d->error = QSqlError("Unable to delete row"_L1, QString(), QSqlError::StatementError);
        return false;
    }

    return d->exec(SqlTm::concat(stmt, where), prepStatement, QSqlRecord() /* no new values */, whereValues);
}